

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreBroker.cpp
# Opt level: O2

void __thiscall helics::CoreBroker::routeMessage(CoreBroker *this,ActionMessage *cmd)

{
  GlobalFederateId fedid;
  route_id rVar1;
  ulong uVar2;
  
  fedid.gid = (cmd->dest_id).gid;
  uVar2 = 0;
  if ((fedid.gid != 0) && (fedid.gid != (this->super_BrokerBase).higher_broker_id.gid)) {
    rVar1 = getRoute(this,fedid);
    uVar2 = (ulong)(uint)rVar1.rid;
  }
  (*(this->super_Broker)._vptr_Broker[0x23])(this,uVar2,cmd);
  return;
}

Assistant:

void CoreBroker::routeMessage(ActionMessage&& cmd)
{
    if ((cmd.dest_id == parent_broker_id) || (cmd.dest_id == higher_broker_id)) {
        transmit(parent_route_id, std::move(cmd));
    } else {
        auto route = getRoute(cmd.dest_id);
        transmit(route, std::move(cmd));
    }
}